

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::source_linenum_formatter<spdlog::details::scoped_padder>::format
          (source_linenum_formatter<spdlog::details::scoped_padder> *this,log_msg *msg,tm *param_2,
          memory_buf_t *dest)

{
  uint uVar1;
  char *pcVar2;
  char *__src;
  uint uVar3;
  ptrdiff_t _Num;
  size_t __n;
  ulong uVar4;
  scoped_padder p;
  format_int fStack_78;
  scoped_padder local_58;
  
  uVar1 = (msg->source).line;
  if (uVar1 != 0) {
    uVar3 = 0x1f;
    if ((uVar1 | 1) != 0) {
      for (; (uVar1 | 1) >> uVar3 == 0; uVar3 = uVar3 - 1) {
      }
    }
    uVar3 = (uVar3 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
    scoped_padder::scoped_padder
              (&local_58,
               (ulong)((uVar3 + 1) -
                      (uint)(uVar1 < *(uint *)(::fmt::v6::internal::basic_data<void>::
                                               zero_or_powers_of_10_32 + (ulong)uVar3 * 4))),
               &(this->super_flag_formatter).padinfo_,dest);
    uVar1 = (msg->source).line;
    uVar3 = -uVar1;
    if (0 < (int)uVar1) {
      uVar3 = uVar1;
    }
    pcVar2 = ::fmt::v6::format_int::format_decimal(&fStack_78,(ulong)uVar3);
    __src = pcVar2;
    if ((int)uVar1 < 0) {
      __src = pcVar2 + -1;
      pcVar2[-1] = '-';
    }
    __n = (long)(fStack_78.buffer_ + 0x15) - (long)__src;
    uVar4 = (dest->super_buffer<char>).size_ + __n;
    fStack_78.str_ = __src;
    if ((dest->super_buffer<char>).capacity_ < uVar4) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest,uVar4);
    }
    if (fStack_78.buffer_ + 0x15 != __src) {
      memmove((dest->super_buffer<char>).ptr_ + (dest->super_buffer<char>).size_,__src,__n);
    }
    (dest->super_buffer<char>).size_ = uVar4;
    scoped_padder::~scoped_padder(&local_58);
  }
  return;
}

Assistant:

explicit B_formatter(padding_info padinfo)
        : flag_formatter(padinfo)
    {}